

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

void __thiscall
TagVisitor<XamlTag,_cmGeneratorTarget::XamlData>::TagVisitor
          (TagVisitor<XamlTag,_cmGeneratorTarget::XamlData> *this,cmTarget *target,XamlData *data)

{
  TargetType TVar1;
  cmMakefile *this_00;
  cmGlobalGenerator *pcVar2;
  XamlData *data_local;
  cmTarget *target_local;
  TagVisitor<XamlTag,_cmGeneratorTarget::XamlData> *this_local;
  
  this->Data = data;
  std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::vector(&this->BadObjLibFiles);
  this->Target = target;
  this_00 = cmTarget::GetMakefile(target);
  pcVar2 = cmMakefile::GetGlobalGenerator(this_00);
  this->GlobalGenerator = pcVar2;
  cmsys::RegularExpression::RegularExpression
            (&this->Header,"\\.(h|hh|h\\+\\+|hm|hpp|hxx|in|txx|inl)$");
  TVar1 = cmTarget::GetType(target);
  this->IsObjLib = TVar1 == OBJECT_LIBRARY;
  return;
}

Assistant:

TagVisitor(cmTarget *target, DataType& data)
    : Data(data), Target(target),
    GlobalGenerator(target->GetMakefile()->GetGlobalGenerator()),
    Header(CM_HEADER_REGEX),
    IsObjLib(target->GetType() == cmTarget::OBJECT_LIBRARY)
  {
  }